

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point3f __thiscall pbrt::detail::Stratified3DIter::operator*(Stratified3DIter *this)

{
  RNG *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Point3f PVar7;
  undefined8 local_38;
  
  iVar1 = (this->super_RNGIterator<pbrt::detail::Stratified3DIter>).
          super_IndexingIterator<pbrt::detail::Stratified3DIter>.i;
  iVar2 = this->nx;
  this_00 = &(this->super_RNGIterator<pbrt::detail::Stratified3DIter>).rng;
  iVar3 = this->ny;
  fVar4 = RNG::Uniform<float>(this_00);
  auVar5._0_4_ = (fVar4 + (float)(iVar1 % iVar2)) / (float)this->nx;
  auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
  fVar4 = RNG::Uniform<float>(this_00);
  auVar6._0_4_ = (fVar4 + (float)(int)((long)((ulong)(uint)((int)((long)iVar1 / (long)iVar2) >> 0x1f
                                                           ) << 0x20 |
                                             (long)iVar1 / (long)iVar2 & 0xffffffffU) % (long)iVar3)
                 ) / (float)this->ny;
  auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar5 = vinsertps_avx(auVar5,auVar6,0x10);
  fVar4 = RNG::Uniform<float>(this_00);
  PVar7.super_Tuple3<pbrt::Point3,_float>.z =
       (fVar4 + (float)(iVar1 / (iVar3 * iVar2))) / (float)this->nz;
  local_38 = auVar5._0_8_;
  PVar7.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_38;
  PVar7.super_Tuple3<pbrt::Point3,_float>.y = (float)local_38._4_4_;
  return (Point3f)PVar7.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point3f operator*() {
        int ix = i % nx;
        int iy = (i / nx) % ny;
        int iz = i / (nx * ny);
        return {(ix + rng.Uniform<Float>()) / nx, (iy + rng.Uniform<Float>()) / ny,
                (iz + rng.Uniform<Float>()) / nz};
    }